

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtree.c
# Opt level: O0

uint32 prune_leaves(dtree_node_t *node,pset_t *pset)

{
  dtree_node_t *node_00;
  dtree_node_t *node_01;
  uint32 local_38;
  uint32 local_34;
  uint32 n_clust;
  uint32 y_clust;
  dtree_node_t *n;
  dtree_node_t *y;
  pset_t *pset_local;
  dtree_node_t *node_local;
  
  if ((node->y == (dtree_node_str *)0x0) && (node->n == (dtree_node_str *)0x0)) {
    node_local._4_4_ = 0xffffffff;
  }
  else {
    node_00 = node->y;
    node_01 = node->n;
    if ((node_00->y == (dtree_node_str *)0x0) && (node_00->n == (dtree_node_str *)0x0)) {
      local_34 = node_00->clust;
    }
    else {
      local_34 = prune_leaves(node_00,pset);
    }
    if ((node_01->y == (dtree_node_str *)0x0) && (node_01->n == (dtree_node_str *)0x0)) {
      local_38 = node_01->clust;
    }
    else {
      local_38 = prune_leaves(node_01,pset);
    }
    if ((local_34 == 0xffffffff) || (local_34 != local_38)) {
      node_local._4_4_ = 0xffffffff;
    }
    else {
      node->n = (dtree_node_str *)0x0;
      node->y = (dtree_node_str *)0x0;
      node->clust = local_34;
      node_local._4_4_ = local_34;
    }
  }
  return node_local._4_4_;
}

Assistant:

uint32
prune_leaves(dtree_node_t *node,
	     pset_t *pset)
{
    dtree_node_t *y, *n;
    uint32 y_clust, n_clust;

    if (IS_LEAF(node))
	return NO_CLUST;

    y = node->y;
    n = node->n;
    
    if (!IS_LEAF(y)) {
	y_clust = prune_leaves(y, pset);
    }
    else {
	y_clust = y->clust;
    }

    if (!IS_LEAF(n)) {
	n_clust = prune_leaves(n, pset);
    }
    else {
	n_clust = n->clust;
    }


    if ((y_clust != NO_CLUST) && (y_clust == n_clust)) {
	node->y = node->n = NULL;
	node->clust = y_clust;

	return y_clust;
    }

    return NO_CLUST;
}